

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base64.c
# Opt level: O0

int cmsysBase64_Decode3(uchar *src,uchar *dest)

{
  uchar uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uchar d3;
  uchar d2;
  uchar d1;
  uchar d0;
  uchar *dest_local;
  uchar *src_local;
  
  uVar1 = kwsysBase64DecodeChar(*src);
  bVar2 = kwsysBase64DecodeChar(src[1]);
  bVar3 = kwsysBase64DecodeChar(src[2]);
  bVar4 = kwsysBase64DecodeChar(src[3]);
  if ((((uVar1 == 0xff) || (bVar2 == 0xff)) || (bVar3 == 0xff)) || (bVar4 == 0xff)) {
    src_local._4_4_ = 0;
  }
  else {
    *dest = uVar1 << 2 | (byte)((int)(uint)bVar2 >> 4) & 3;
    dest[1] = bVar2 << 4 | (byte)((int)(uint)bVar3 >> 2) & 0xf;
    dest[2] = bVar3 << 6 | bVar4 & 0x3f;
    if (src[2] == '=') {
      src_local._4_4_ = 1;
    }
    else if (src[3] == '=') {
      src_local._4_4_ = 2;
    }
    else {
      src_local._4_4_ = 3;
    }
  }
  return src_local._4_4_;
}

Assistant:

int kwsysBase64_Decode3(const unsigned char* src, unsigned char* dest)
{
  unsigned char d0;
  unsigned char d1;
  unsigned char d2;
  unsigned char d3;

  d0 = kwsysBase64DecodeChar(src[0]);
  d1 = kwsysBase64DecodeChar(src[1]);
  d2 = kwsysBase64DecodeChar(src[2]);
  d3 = kwsysBase64DecodeChar(src[3]);

  /* Make sure all characters were valid */

  if (d0 == 0xFF || d1 == 0xFF || d2 == 0xFF || d3 == 0xFF) {
    return 0;
  }

  /* Decode the 3 bytes */

  dest[0] = (unsigned char)(((d0 << 2) & 0xFC) | ((d1 >> 4) & 0x03));
  dest[1] = (unsigned char)(((d1 << 4) & 0xF0) | ((d2 >> 2) & 0x0F));
  dest[2] = (unsigned char)(((d2 << 6) & 0xC0) | ((d3 >> 0) & 0x3F));

  /* Return the number of bytes actually decoded */

  if (src[2] == '=') {
    return 1;
  }
  if (src[3] == '=') {
    return 2;
  }
  return 3;
}